

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

GBufferFilm *
pbrt::GBufferFilm::Create
          (ParameterDictionary *parameters,Float exposureTime,CameraTransform *cameraTransform,
          Filter *filter,RGBColorSpace *colorSpace,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  GBufferFilm *pGVar4;
  CameraTransform *in_RSI;
  ParameterDictionary *in_RDI;
  undefined8 in_R9;
  Float FVar5;
  bool applyInverse;
  AnimatedTransform outputFromRender;
  string coordinateSystem;
  FilmBaseParameters filmBaseParameters;
  PixelSensor *sensor;
  bool writeFP16;
  Float maxComponentValue;
  Transform *in_stack_fffffffffffff828;
  AnimatedTransform *in_stack_fffffffffffff830;
  undefined7 in_stack_fffffffffffff848;
  undefined1 in_stack_fffffffffffff84f;
  AnimatedTransform *in_stack_fffffffffffff850;
  undefined7 in_stack_fffffffffffff858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff860;
  AnimatedTransform *args_1;
  char *in_stack_fffffffffffff868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined6 in_stack_fffffffffffff878;
  string *name;
  ParameterDictionary *this_00;
  undefined1 local_730 [32];
  AnimatedTransform *in_stack_fffffffffffff8f0;
  string *in_stack_fffffffffffff900;
  string *in_stack_fffffffffffff908;
  FileLoc *in_stack_fffffffffffffa38;
  Float in_stack_fffffffffffffa44;
  RGBColorSpace *in_stack_fffffffffffffa48;
  ParameterDictionary *in_stack_fffffffffffffa50;
  Allocator in_stack_fffffffffffffa58;
  undefined1 local_474 [628];
  FileLoc *in_stack_fffffffffffffe00;
  PixelSensor *in_stack_fffffffffffffe08;
  Filter *in_stack_fffffffffffffe10;
  ParameterDictionary *in_stack_fffffffffffffe18;
  FilmBaseParameters *in_stack_fffffffffffffe20;
  undefined1 local_1b9 [40];
  undefined1 local_191 [33];
  string local_170 [39];
  undefined1 local_149 [33];
  string local_128 [88];
  string local_d0 [32];
  undefined1 local_b0 [23];
  allocator<char> local_99;
  string local_98 [35];
  undefined1 local_75;
  allocator<char> local_61;
  string local_60 [36];
  Float local_3c;
  CameraTransform *local_20;
  ParameterDictionary *local_10;
  undefined8 local_8;
  
  local_20 = in_RSI;
  local_10 = in_RDI;
  local_8 = in_R9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff870,in_stack_fffffffffffff868,
             (allocator<char> *)in_stack_fffffffffffff860);
  FVar5 = ParameterDictionary::GetOneFloat
                    ((ParameterDictionary *)in_stack_fffffffffffff830,
                     (string *)in_stack_fffffffffffff828,0.0);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  local_3c = FVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff870,in_stack_fffffffffffff868,
             (allocator<char> *)in_stack_fffffffffffff860);
  bVar1 = ParameterDictionary::GetOneBool
                    ((ParameterDictionary *)in_stack_fffffffffffff830,
                     (string *)in_stack_fffffffffffff828,false);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  local_b0._0_8_ = local_8;
  local_75 = bVar1;
  local_b0._8_8_ =
       PixelSensor::Create(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
                           in_stack_fffffffffffffa44,in_stack_fffffffffffffa38,
                           in_stack_fffffffffffffa58);
  this_00 = local_10;
  Filter::Filter((Filter *)in_stack_fffffffffffff830,(Filter *)in_stack_fffffffffffff828);
  FilmBaseParameters::FilmBaseParameters
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::__cxx11::string::string(local_128,local_d0);
  name = (string *)local_149;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff870,in_stack_fffffffffffff868,
             (allocator<char> *)in_stack_fffffffffffff860);
  uVar2 = HasExtension(in_stack_fffffffffffff908,in_stack_fffffffffffff900);
  bVar3 = uVar2 ^ 0xff;
  std::__cxx11::string::~string((string *)(local_149 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_149);
  std::__cxx11::string::~string(local_128);
  if ((bVar3 & 1) != 0) {
    ErrorExit<std::__cxx11::string&>
              ((FileLoc *)in_stack_fffffffffffff870,in_stack_fffffffffffff868,
               in_stack_fffffffffffff860);
  }
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_191;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)local_10,(allocator<char> *)in_stack_fffffffffffff860);
  args_1 = (AnimatedTransform *)local_1b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)local_10,(allocator<char> *)args_1);
  ParameterDictionary::GetOneString
            (this_00,name,(string *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffff878)));
  std::__cxx11::string::~string((string *)(local_1b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1b9);
  std::__cxx11::string::~string((string *)(local_191 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_191);
  AnimatedTransform::AnimatedTransform(in_stack_fffffffffffff8f0);
  uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff830,(char *)in_stack_fffffffffffff828);
  if ((bool)uVar2) {
    in_stack_fffffffffffff850 = CameraTransform::RenderFromCamera(local_20);
    memcpy(local_474,in_stack_fffffffffffff850,0x2b8);
  }
  else {
    in_stack_fffffffffffff84f =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff830,(char *)in_stack_fffffffffffff828);
    if (!(bool)in_stack_fffffffffffff84f) {
      ErrorExit<std::__cxx11::string&>
                ((FileLoc *)this,(char *)local_10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
    }
    CameraTransform::WorldFromRender(local_20);
    AnimatedTransform::AnimatedTransform(in_stack_fffffffffffff830,in_stack_fffffffffffff828);
    memcpy(local_474,local_730,0x2b8);
  }
  pGVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::GBufferFilm,pbrt::FilmBaseParameters&,pbrt::AnimatedTransform&,bool&,pbrt::RGBColorSpace_const*&,float&,bool&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     ((polymorphic_allocator<std::byte> *)this,(FilmBaseParameters *)local_10,args_1
                      ,(bool *)CONCAT17(uVar2,in_stack_fffffffffffff858),
                      (RGBColorSpace **)in_stack_fffffffffffff850,
                      (float *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848),
                      (bool *)name,(polymorphic_allocator<std::byte> *)this_00);
  std::__cxx11::string::~string(local_170);
  FilmBaseParameters::~FilmBaseParameters((FilmBaseParameters *)0x8732a7);
  return pGVar4;
}

Assistant:

GBufferFilm *GBufferFilm::Create(const ParameterDictionary &parameters,
                                 Float exposureTime,
                                 const CameraTransform &cameraTransform, Filter filter,
                                 const RGBColorSpace *colorSpace, const FileLoc *loc,
                                 Allocator alloc) {
    Float maxComponentValue = parameters.GetOneFloat("maxcomponentvalue", Infinity);
    bool writeFP16 = parameters.GetOneBool("savefp16", true);

    PixelSensor *sensor =
        PixelSensor::Create(parameters, colorSpace, exposureTime, loc, alloc);

    FilmBaseParameters filmBaseParameters(parameters, filter, sensor, loc);

    if (!HasExtension(filmBaseParameters.filename, "exr"))
        ErrorExit(loc, "%s: EXR is the only format supported by the GBufferFilm.",
                  filmBaseParameters.filename);

    std::string coordinateSystem = parameters.GetOneString("coordinatesystem", "camera");
    AnimatedTransform outputFromRender;
    bool applyInverse = false;
    if (coordinateSystem == "camera") {
        outputFromRender = cameraTransform.RenderFromCamera();
        applyInverse = true;
    } else if (coordinateSystem == "world")
        outputFromRender = AnimatedTransform(cameraTransform.WorldFromRender());
    else
        ErrorExit(loc,
                  "%s: unknown coordinate system for GBufferFilm. (Expecting \"camera\" "
                  "or \"world\".)",
                  coordinateSystem);

    return alloc.new_object<GBufferFilm>(filmBaseParameters, outputFromRender,
                                         applyInverse, colorSpace, maxComponentValue,
                                         writeFP16, alloc);
}